

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineImageSamplingInstance.cpp
# Opt level: O0

void vkt::pipeline::anon_unknown_0::swizzle
               (ConstPixelBufferAccess *src,PixelBufferAccess *dst,VkComponentMapping *swz)

{
  bool bVar1;
  TextureChannelClass TVar2;
  TextureFormat *pTVar3;
  TextureChannelClass chnClass;
  VkComponentMapping *swz_local;
  PixelBufferAccess *dst_local;
  ConstPixelBufferAccess *src_local;
  
  pTVar3 = tcu::ConstPixelBufferAccess::getFormat(&dst->super_ConstPixelBufferAccess);
  TVar2 = tcu::getTextureChannelClass(pTVar3->type);
  if (TVar2 == TEXTURECHANNELCLASS_SIGNED_INTEGER) {
    swizzleT<int>(src,dst,swz);
  }
  else if (TVar2 == TEXTURECHANNELCLASS_UNSIGNED_INTEGER) {
    swizzleT<unsigned_int>(src,dst,swz);
  }
  else {
    pTVar3 = tcu::ConstPixelBufferAccess::getFormat(src);
    bVar1 = tcu::isSRGB(*pTVar3);
    if (bVar1) {
      pTVar3 = tcu::ConstPixelBufferAccess::getFormat(&dst->super_ConstPixelBufferAccess);
      bVar1 = tcu::isSRGB(*pTVar3);
      if (!bVar1) {
        swizzleFromSRGB(src,dst,swz);
        return;
      }
    }
    swizzleT<float>(src,dst,swz);
  }
  return;
}

Assistant:

void swizzle (const tcu::ConstPixelBufferAccess& src, const tcu::PixelBufferAccess& dst, const vk::VkComponentMapping& swz)
{
	const tcu::TextureChannelClass	chnClass	= tcu::getTextureChannelClass(dst.getFormat().type);

	DE_ASSERT(src.getWidth() == dst.getWidth() &&
			  src.getHeight() == dst.getHeight() &&
			  src.getDepth() == dst.getDepth());

	if (chnClass == tcu::TEXTURECHANNELCLASS_SIGNED_INTEGER)
		swizzleT<deInt32>(src, dst, swz);
	else if (chnClass == tcu::TEXTURECHANNELCLASS_UNSIGNED_INTEGER)
		swizzleT<deUint32>(src, dst, swz);
	else if (tcu::isSRGB(src.getFormat()) && !tcu::isSRGB(dst.getFormat()))
		swizzleFromSRGB(src, dst, swz);
	else
		swizzleT<float>(src, dst, swz);
}